

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O1

void json_append_string(lua_State *l,strbuf_t *json,int lindex)

{
  byte bVar1;
  ulong in_RAX;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  size_t len;
  ulong local_28;
  
  local_28 = in_RAX;
  pcVar2 = lua_tolstring(l,lindex,&local_28);
  iVar3 = (int)local_28 * 6 + 2;
  if (~json->length + json->size < iVar3) {
    strbuf_resize(json,iVar3 + json->length);
  }
  iVar3 = json->length;
  json->length = iVar3 + 1;
  json->buf[iVar3] = '\"';
  if (local_28 != 0) {
    uVar4 = 0;
    do {
      bVar1 = pcVar2[uVar4];
      if (char2escape[bVar1] == (char *)0x0) {
        iVar3 = json->length;
        json->length = iVar3 + 1;
        json->buf[iVar3] = bVar1;
      }
      else {
        strbuf_append_string(json,char2escape[bVar1]);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < local_28);
  }
  iVar3 = json->length;
  json->length = iVar3 + 1;
  json->buf[iVar3] = '\"';
  return;
}

Assistant:

static void json_append_string(lua_State *l, strbuf_t *json, int lindex)
{
    const char *escstr;
    const char *str;
    size_t len;
    size_t i;

    str = lua_tolstring(l, lindex, &len);

    /* Worst case is len * 6 (all unicode escapes).
     * This buffer is reused constantly for small strings
     * If there are any excess pages, they won't be hit anyway.
     * This gains ~5% speedup. */
    strbuf_ensure_empty_length(json, len * 6 + 2);

    strbuf_append_char_unsafe(json, '\"');
    for (i = 0; i < len; i++) {
        escstr = char2escape[(unsigned char)str[i]];
        if (escstr)
            strbuf_append_string(json, escstr);
        else
            strbuf_append_char_unsafe(json, str[i]);
    }
    strbuf_append_char_unsafe(json, '\"');
}